

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

void __thiscall mognetwork::Selector::setFds(Selector *this)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  int *piVar4;
  long in_RDI;
  iterator it_1;
  iterator it;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  list<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  long local_28;
  uint local_1c;
  long local_18;
  uint local_c;
  
  *(undefined4 *)(in_RDI + 0x178) = 0;
  local_18 = in_RDI + 0x78;
  for (local_c = 0; local_c < 0x10; local_c = local_c + 1) {
    *(undefined8 *)(local_18 + (ulong)local_c * 8) = 0;
  }
  local_28 = in_RDI + 0xf8;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    *(undefined8 *)(local_28 + (ulong)local_1c * 8) = 0;
  }
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
    bVar2 = std::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    piVar3 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x1190f9);
    iVar1 = *piVar3;
    piVar3 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x11911e);
    *(ulong *)(in_RDI + 0x78 + (long)(*piVar3 / 0x40) * 8) =
         1L << ((byte)((long)iVar1 % 0x40) & 0x3f) |
         *(ulong *)(in_RDI + 0x78 + (long)(*piVar3 / 0x40) * 8);
    piVar3 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x119156);
    piVar4 = std::max<int>((int *)(in_RDI + 0x178),piVar3);
    *(int *)(in_RDI + 0x178) = *piVar4;
    std::_List_iterator<int>::operator++(&local_30);
  }
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  while( true ) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
    bVar2 = std::operator!=(&local_40,&local_48);
    if (!bVar2) break;
    piVar3 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x1191ca);
    iVar1 = *piVar3;
    piVar3 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x1191ef);
    *(ulong *)(in_RDI + 0xf8 + (long)(*piVar3 / 0x40) * 8) =
         1L << ((byte)((long)iVar1 % 0x40) & 0x3f) |
         *(ulong *)(in_RDI + 0xf8 + (long)(*piVar3 / 0x40) * 8);
    piVar3 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x11922d);
    piVar4 = std::max<int>((int *)(in_RDI + 0x178),piVar3);
    *(int *)(in_RDI + 0x178) = *piVar4;
    std::_List_iterator<int>::operator++(&local_40);
  }
  return;
}

Assistant:

void Selector::setFds()
  {
    m_maxFds = 0;
    FD_ZERO(&m_rdfs);
    FD_ZERO(&m_wdfs);

    for (std::list<SocketFD>::iterator it = m_readSockets.begin();
	 it != m_readSockets.end(); ++it)
      {
	FD_SET(*it, &m_rdfs);
	m_maxFds = std::max(m_maxFds, *it);
      }

    for (std::list<SocketFD>::iterator it = m_writeSockets.begin();
	 it != m_writeSockets.end(); ++it)
      {
	FD_SET(*it, &m_wdfs);
	m_maxFds = std::max(m_maxFds, *it);
      }
  }